

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep-lstm.cc
# Opt level: O1

void __thiscall
cnn::DeepLSTMBuilder::DeepLSTMBuilder
          (DeepLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,Model *model)

{
  long lVar1;
  Parameters *pPVar2;
  Parameters *pPVar3;
  Parameters *pPVar4;
  Parameters *pPVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  initializer_list<cnn::Parameters_*> __l;
  uint v;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> ps;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> local_f8;
  allocator_type local_d9;
  DeepLSTMBuilder *local_d8;
  undefined1 local_d0 [16];
  Parameters *local_c0;
  uint uStack_b8;
  uint local_b4;
  uint uStack_b0;
  undefined4 uStack_ac;
  Parameters *local_a8;
  Parameters *local_a0;
  Parameters *local_98;
  Parameters *local_90;
  Parameters *local_88;
  Parameters *local_80;
  uint local_78;
  uint local_74;
  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  *local_70;
  ulong local_68;
  Parameters *local_60;
  Parameters *local_58;
  Parameters *local_50;
  Parameters *local_48;
  Parameters *local_40;
  Parameters *local_38;
  
  (this->super_RNNBuilder).cur.t = -1;
  *(undefined8 *)&(this->super_RNNBuilder).sm = 0;
  *(undefined8 *)
   ((long)&(this->super_RNNBuilder).head.
           super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__DeepLSTMBuilder_003100f8;
  auVar10 = ZEXT464(0) << 0x40;
  this->params = (vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                  )auVar10._0_24_;
  this->param_vars =
       (vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
        )auVar10._24_24_;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar10._48_8_;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar10._56_8_;
  *(undefined1 (*) [64])
   &(this->h).
    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar10;
  auVar9 = ZEXT432(0) << 0x40;
  this->h0 = (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>)auVar9._0_24_;
  (this->c0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auVar9._24_8_;
  *(undefined1 (*) [32])
   &(this->h0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = auVar9;
  this->layers = layers;
  if (layers != 0) {
    local_70 = &this->params;
    local_78 = hidden_dim + input_dim;
    uVar7 = 0;
    local_d8 = this;
    local_74 = layers;
    do {
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = input_dim;
      local_b4 = 0;
      uStack_b0 = 1;
      lVar1 = 0;
      do {
        uVar6 = (ulong)local_b4;
        local_b4 = local_b4 + 1;
        *(undefined4 *)(local_d0 + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_f8.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      pPVar2 = Model::add_parameters(model,(Dim *)local_d0,0.0);
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_b4 = 0;
      uStack_b0 = 1;
      lVar1 = 0;
      do {
        uVar6 = (ulong)local_b4;
        local_b4 = local_b4 + 1;
        *(undefined4 *)(local_d0 + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_f8.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      local_38 = Model::add_parameters(model,(Dim *)local_d0,0.0);
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_b4 = 0;
      uStack_b0 = 1;
      lVar1 = 0;
      do {
        uVar6 = (ulong)local_b4;
        local_b4 = local_b4 + 1;
        *(undefined4 *)(local_d0 + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_f8.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      local_40 = Model::add_parameters(model,(Dim *)local_d0,0.0);
      local_b4 = 1;
      uStack_b0 = 1;
      local_d0._0_4_ = hidden_dim;
      local_48 = Model::add_parameters(model,(Dim *)local_d0,0.0);
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = input_dim;
      local_b4 = 0;
      uStack_b0 = 1;
      lVar1 = 0;
      do {
        uVar6 = (ulong)local_b4;
        local_b4 = local_b4 + 1;
        *(undefined4 *)(local_d0 + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_f8.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      pPVar3 = Model::add_parameters(model,(Dim *)local_d0,0.0);
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_b4 = 0;
      uStack_b0 = 1;
      lVar1 = 0;
      do {
        uVar6 = (ulong)local_b4;
        local_b4 = local_b4 + 1;
        *(undefined4 *)(local_d0 + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_f8.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      local_50 = Model::add_parameters(model,(Dim *)local_d0,0.0);
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_b4 = 0;
      uStack_b0 = 1;
      lVar1 = 0;
      do {
        uVar6 = (ulong)local_b4;
        local_b4 = local_b4 + 1;
        *(undefined4 *)(local_d0 + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_f8.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      local_68 = uVar7;
      local_58 = pPVar3;
      local_60 = Model::add_parameters(model,(Dim *)local_d0,0.0);
      local_b4 = 1;
      uStack_b0 = 1;
      pPVar3 = Model::add_parameters(model,(Dim *)local_d0,0.0);
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = input_dim;
      local_b4 = 0;
      uStack_b0 = 1;
      lVar1 = 0;
      do {
        uVar7 = (ulong)local_b4;
        local_b4 = local_b4 + 1;
        *(undefined4 *)(local_d0 + uVar7 * 4) =
             *(undefined4 *)
              ((long)&local_f8.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      pPVar4 = Model::add_parameters(model,(Dim *)local_d0,0.0);
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_f8.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_b4 = 0;
      uStack_b0 = 1;
      lVar1 = 0;
      do {
        uVar7 = (ulong)local_b4;
        local_b4 = local_b4 + 1;
        *(undefined4 *)(local_d0 + uVar7 * 4) =
             *(undefined4 *)
              ((long)&local_f8.
                      super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar1);
        lVar1 = lVar1 + 4;
      } while (lVar1 != 8);
      pPVar5 = Model::add_parameters(model,(Dim *)local_d0,0.0);
      local_b4 = 1;
      uStack_b0 = 1;
      local_80 = Model::add_parameters(model,(Dim *)local_d0,0.0);
      local_d0._8_8_ = local_38;
      local_c0 = local_40;
      uStack_b8 = (uint)local_48;
      local_b4 = (uint)((ulong)local_48 >> 0x20);
      uStack_b0 = (uint)local_58;
      uStack_ac = (undefined4)((ulong)local_58 >> 0x20);
      local_a8 = local_50;
      local_a0 = local_60;
      __l._M_len = 0xb;
      __l._M_array = (iterator)local_d0;
      local_d0._0_8_ = pPVar2;
      local_98 = pPVar3;
      local_90 = pPVar4;
      local_88 = pPVar5;
      std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::vector
                (&local_f8,__l,&local_d9);
      std::
      vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
      ::push_back(local_70,&local_f8);
      uVar7 = local_68;
      if ((void *)CONCAT44(local_f8.
                           super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (uint)local_f8.
                                 super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_f8.
                                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)local_f8.
                                               super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start));
      }
      uVar8 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar8;
      input_dim = local_78;
    } while (uVar8 != local_74);
  }
  return;
}

Assistant:

DeepLSTMBuilder::DeepLSTMBuilder(unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         Model* model) : layers(layers) {
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameters* p_x2i = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2i = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_c2i = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bi = model->add_parameters({hidden_dim});

    // o
    Parameters* p_x2o = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2o = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_c2o = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bo = model->add_parameters({hidden_dim});

    // c
    Parameters* p_x2c = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2c = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bc = model->add_parameters({hidden_dim});
    layer_input_dim = hidden_dim + input_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameters*> ps = {p_x2i, p_h2i, p_c2i, p_bi, p_x2o, p_h2o, p_c2o, p_bo, p_x2c, p_h2c, p_bc};
    params.push_back(ps);
  }  // layers
}